

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

int mbedtls_md_hmac_starts(mbedtls_md_context_t *ctx,uchar *key,size_t keylen)

{
  uchar *__s;
  mbedtls_md_info_t *pmVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  size_t __n;
  uchar *__s_00;
  uchar sum [64];
  uchar local_68 [64];
  
  if (ctx == (mbedtls_md_context_t *)0x0) {
    return -0x5100;
  }
  pmVar1 = ctx->md_info;
  if (pmVar1 == (mbedtls_md_info_t *)0x0) {
    return -0x5100;
  }
  __s_00 = (uchar *)ctx->hmac_ctx;
  if (__s_00 == (uchar *)0x0) {
    return -0x5100;
  }
  __n = (size_t)pmVar1->block_size;
  if (__n < keylen) {
    iVar2 = (*pmVar1->starts_func)(ctx->md_ctx);
    if (((iVar2 != 0) || (iVar2 = (*ctx->md_info->update_func)(ctx->md_ctx,key,keylen), iVar2 != 0))
       || (iVar2 = (*ctx->md_info->finish_func)(ctx->md_ctx,local_68), iVar2 != 0))
    goto LAB_00115aa5;
    __s_00 = (uchar *)ctx->hmac_ctx;
    keylen = (size_t)ctx->md_info->size;
    __n = (size_t)ctx->md_info->block_size;
    key = local_68;
  }
  __s = __s_00 + __n;
  memset(__s_00,0x36,__n);
  memset(__s,0x5c,(long)ctx->md_info->block_size);
  if (keylen != 0) {
    sVar3 = 0;
    do {
      __s_00[sVar3] = __s_00[sVar3] ^ key[sVar3];
      __s[sVar3] = __s[sVar3] ^ key[sVar3];
      sVar3 = sVar3 + 1;
    } while (keylen != sVar3);
  }
  iVar2 = (*ctx->md_info->starts_func)(ctx->md_ctx);
  if (iVar2 == 0) {
    iVar2 = (*ctx->md_info->update_func)(ctx->md_ctx,__s_00,(long)ctx->md_info->block_size);
  }
LAB_00115aa5:
  lVar4 = 0;
  do {
    local_68[lVar4] = '\0';
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  return iVar2;
}

Assistant:

int mbedtls_md_hmac_starts( mbedtls_md_context_t *ctx, const unsigned char *key, size_t keylen )
{
    int ret;
    unsigned char sum[MBEDTLS_MD_MAX_SIZE];
    unsigned char *ipad, *opad;
    size_t i;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( keylen > (size_t) ctx->md_info->block_size )
    {
        if( ( ret = ctx->md_info->starts_func( ctx->md_ctx ) ) != 0 )
            goto cleanup;
        if( ( ret = ctx->md_info->update_func( ctx->md_ctx, key, keylen ) ) != 0 )
            goto cleanup;
        if( ( ret = ctx->md_info->finish_func( ctx->md_ctx, sum ) ) != 0 )
            goto cleanup;

        keylen = ctx->md_info->size;
        key = sum;
    }

    ipad = (unsigned char *) ctx->hmac_ctx;
    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    memset( ipad, 0x36, ctx->md_info->block_size );
    memset( opad, 0x5C, ctx->md_info->block_size );

    for( i = 0; i < keylen; i++ )
    {
        ipad[i] = (unsigned char)( ipad[i] ^ key[i] );
        opad[i] = (unsigned char)( opad[i] ^ key[i] );
    }

    if( ( ret = ctx->md_info->starts_func( ctx->md_ctx ) ) != 0 )
        goto cleanup;
    if( ( ret = ctx->md_info->update_func( ctx->md_ctx, ipad,
                                           ctx->md_info->block_size ) ) != 0 )
        goto cleanup;

cleanup:
    mbedtls_zeroize( sum, sizeof( sum ) );

    return( ret );
}